

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 07.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  int local_1c;
  int i;
  char **argv_local;
  int argc_local;
  
  setlocale(6,"");
  for (local_1c = 0; local_1c < 5; local_1c = local_1c + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6ac);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"Shopenhauer!");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6d8);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"Goethe!");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"Schiler!");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"Richard Wagner!");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"Georges Bizet!");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"Peter gast");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_750);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  poVar1 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_766);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Kant");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Parmenides");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Hegel");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Richard Wagner!");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,anon_var_dwarf_7a6);
  std::operator<<((ostream *)&std::cout,"Com Richard Wagner, quando percebeu o nome ");
  std::operator<<((ostream *)&std::cout,"Dele ligado ao antisemitismo e outros ");
  std::operator<<((ostream *)&std::cout,anon_var_dwarf_7e8);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    setlocale(LC_ALL, "");

    for (int i = 0; i < 5; i++)
    {

        cout << "Heráclito!" << endl;
        cout << "Shopenhauer!" << endl;
        cout << "Lou Salomé!" << endl;
        cout << "Goethe!" << endl;
        cout << "Schiler!" << endl;
        cout << "Richard Wagner!" << endl;
        cout << "Georges Bizet!" << endl;
        cout << "Peter gast" << endl;
        cout << "São Inspirações Nietzscheanas!" << endl;
    }

    cout << endl
         << endl;
    cout << "Anti inspirações Nietzscheanas!" << endl;
    cout << "Kant" << endl;
    cout << "Parmenides" << endl;
    cout << "Hegel" << endl;
    cout << "Richard Wagner!" << endl;
    cout << endl
         << endl;
    cout << "P.S: Nietzsche sofreu uma séria decepção ";
    cout << "Com Richard Wagner, quando percebeu o nome ";
    cout << "Dele ligado ao antisemitismo e outros ";
    cout << "preconceitos da época.";

    return 0;
}